

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_518f23::HandleRemoveImpl
          (anon_unknown_dwarf_518f23 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse,cmExecutionStatus *status)

{
  cmMakefile *this_00;
  undefined1 in_AL;
  bool bVar1;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  string *psVar2;
  Status SVar3;
  long *plVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long *plVar6;
  anon_unknown_dwarf_518f23 *paVar7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string fileName;
  string r;
  char *__end;
  string local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 *local_68;
  undefined8 local_60;
  pointer local_58;
  long local_50;
  undefined8 local_48;
  char *local_40;
  char *local_38;
  
  paVar7 = this + 0x20;
  if (paVar7 != (anon_unknown_dwarf_518f23 *)args) {
    local_38 = "REMOVE";
    if (recurse) {
      local_38 = "REMOVE_RECURSE";
    }
    local_40 = local_38 + (ulong)recurse * 8 + 6;
    do {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,*(long *)paVar7,
                 (long)&((*(pointer *)(paVar7 + 8))->_M_dataplus)._M_p + *(long *)paVar7);
      if (local_e0._M_string_length == 0) {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,local_38,local_40);
        this_00 = status->Makefile;
        std::operator+(&local_100,"Ignoring empty file name in ",&local_88);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_100);
        plVar6 = plVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar6) {
          local_c0.field_2._M_allocated_capacity = *plVar6;
          local_c0.field_2._8_8_ = plVar4[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *plVar6;
          local_c0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c0._M_string_length = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,
                          (ulong)(local_c0.field_2._M_allocated_capacity + 1));
        }
        paVar5 = &local_100.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar5) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          paVar5 = extraout_RAX;
        }
        in_AL = SUB81(paVar5,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          in_AL = extraout_AL;
        }
      }
      else {
        bVar1 = cmsys::SystemTools::FileIsFullPath(&local_e0);
        if (!bVar1) {
          psVar2 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
          local_88._M_string_length = (size_type)(psVar2->_M_dataplus)._M_p;
          local_88._M_dataplus._M_p = (pointer)psVar2->_M_string_length;
          local_88.field_2._M_allocated_capacity = 0;
          local_c0._M_dataplus._M_p = (pointer)0x0;
          local_c0._M_string_length = 1;
          local_c0.field_2._M_allocated_capacity = (long)&local_c0.field_2 + 8;
          local_c0.field_2._M_local_buf[8] = 0x2f;
          local_88.field_2._8_8_ = 1;
          local_60 = 0;
          local_50 = *(long *)paVar7;
          local_58 = *(pointer *)(paVar7 + 8);
          local_48 = 0;
          views._M_len = 3;
          views._M_array = (iterator)&local_88;
          local_68 = (undefined1 *)local_c0.field_2._M_allocated_capacity;
          cmCatViews(&local_100,views);
          std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
        }
        bVar1 = cmsys::SystemTools::FileIsDirectory(&local_e0);
        if ((!bVar1) || (bVar1 = cmsys::SystemTools::FileIsSymlink(&local_e0), bVar1 || !recurse)) {
          SVar3 = cmsys::SystemTools::RemoveFile(&local_e0);
          in_AL = (undefined1)SVar3.Kind_;
        }
        else {
          in_AL = cmSystemTools::RepeatedRemoveDirectory(&local_e0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        in_AL = extraout_AL_00;
      }
      paVar7 = paVar7 + 0x20;
    } while (paVar7 != (anon_unknown_dwarf_518f23 *)args);
  }
  return (bool)in_AL;
}

Assistant:

bool HandleRemoveImpl(std::vector<std::string> const& args, bool recurse,
                      cmExecutionStatus& status)
{
  for (std::string const& arg :
       cmMakeRange(args).advance(1)) // Get rid of subcommand
  {
    std::string fileName = arg;
    if (fileName.empty()) {
      std::string const r = recurse ? "REMOVE_RECURSE" : "REMOVE";
      status.GetMakefile().IssueMessage(
        MessageType::AUTHOR_WARNING, "Ignoring empty file name in " + r + ".");
      continue;
    }
    if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
      fileName =
        cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', arg);
    }

    if (cmSystemTools::FileIsDirectory(fileName) &&
        !cmSystemTools::FileIsSymlink(fileName) && recurse) {
      cmSystemTools::RepeatedRemoveDirectory(fileName);
    } else {
      cmSystemTools::RemoveFile(fileName);
    }
  }
  return true;
}